

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

float __thiscall pbrt::SampledGrid<float>::Lookup(SampledGrid<float> *this,Point3i *p)

{
  bool bVar1;
  float fVar2;
  Bounds3i sampleBounds;
  Tuple3<pbrt::Point3,_int> local_48;
  Tuple3<pbrt::Point3,_int> local_3c;
  Bounds3<int> local_30;
  
  local_3c.x = 0;
  local_3c.y = 0;
  local_3c.z = 0;
  local_48.z = this->nz;
  local_48.x = this->nx;
  local_48.y = this->ny;
  Bounds3<int>::Bounds3(&local_30,(Point3<int> *)&local_3c,(Point3<int> *)&local_48);
  bVar1 = InsideExclusive<int>(p,&local_30);
  fVar2 = 0.0;
  if (bVar1) {
    fVar2 = (this->values).ptr
            [(long)(p->super_Tuple3<pbrt::Point3,_int>).x +
             (long)this->nx *
             ((long)(p->super_Tuple3<pbrt::Point3,_int>).y +
             (long)this->ny * (long)(p->super_Tuple3<pbrt::Point3,_int>).z)];
  }
  return fVar2;
}

Assistant:

PBRT_CPU_GPU
    T Lookup(const Point3i &p) const {
        Bounds3i sampleBounds(Point3i(0, 0, 0), Point3i(nx, ny, nz));
        if (!InsideExclusive(p, sampleBounds))
            return {};
        return values[(p.z * ny + p.y) * nx + p.x];
    }